

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O0

bool __thiscall iutest::TestSuite::Passed(TestSuite *this)

{
  int iVar1;
  bool local_11;
  TestSuite *this_local;
  
  iVar1 = failed_test_count(this);
  local_11 = false;
  if (iVar1 == 0) {
    local_11 = TestResult::Passed(&this->m_ad_hoc_testresult);
  }
  return local_11;
}

Assistant:

bool            Passed()                const { return failed_test_count() == 0 && m_ad_hoc_testresult.Passed(); }